

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O1

void __thiscall
QAbstractSocketPrivate::emitBytesWritten(QAbstractSocketPrivate *this,qint64 bytes,int channel)

{
  longlong lVar1;
  
  lVar1 = *(longlong *)&this->field_0x8;
  if ((this->emittedBytesWritten == false) && (*(int *)&this->field_0xb4 == channel)) {
    this->emittedBytesWritten = true;
    QIODevice::bytesWritten(lVar1);
    this->emittedBytesWritten = false;
  }
  QIODevice::channelBytesWritten((int)lVar1,(ulong)(uint)channel);
  return;
}

Assistant:

void QAbstractSocketPrivate::emitBytesWritten(qint64 bytes, int channel)
{
    Q_Q(QAbstractSocket);
    // Only emit bytesWritten() when not recursing.
    if (!emittedBytesWritten && channel == currentWriteChannel) {
        QScopedValueRollback<bool> r(emittedBytesWritten);
        emittedBytesWritten = true;
        emit q->bytesWritten(bytes);
    }
    // channelBytesWritten() can be emitted recursively - even for the same channel.
    emit q->channelBytesWritten(channel, bytes);
}